

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O0

size_t trng::utility::
       discrete<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                 (double x,
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first,
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last)

{
  reference pdVar1;
  difference_type dVar2;
  size_t __n;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *in_XMM0_Qa;
  difference_type i3;
  difference_type i2;
  difference_type i1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffffb8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *p_Var3;
  size_t local_30;
  size_t local_28;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_10;
  size_t local_8;
  
  p_Var3 = in_XMM0_Qa;
  pdVar1 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
           operator*(&local_10);
  if (*pdVar1 <= (double)p_Var3) {
    local_28 = 0;
    dVar2 = __gnu_cxx::operator-(p_Var3,in_stack_ffffffffffffffb8);
    local_30 = dVar2 - 1;
    __n = local_28;
    while (local_28 = __n, 1 < (long)(local_30 - local_28)) {
      __n = (long)(local_30 + local_28) / 2;
      p_Var3 = in_XMM0_Qa;
      pdVar1 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator[](&local_10,__n);
      if ((double)p_Var3 <= *pdVar1) {
        local_30 = __n;
        __n = local_28;
      }
    }
    local_8 = local_30;
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

std::size_t discrete(double x, iter first, iter last) {
      using difference_type = typename std::iterator_traits<iter>::difference_type;
      if (x < (*first))
        return 0;
      difference_type i1{0}, i2{last - first - 1};
      while (i2 - i1 > difference_type(1)) {
        const difference_type i3{(i2 + i1) / 2};
        if (x <= first[i3])
          i2 = i3;
        else
          i1 = i3;
      }
      return static_cast<std::size_t>(i2);
    }